

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int ffcalchist(long totalrows,long offset,long firstrow,long nrows,int ncols,iteratorCol *colpars,
              void *userPointer)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  void *pvVar5;
  long in_RCX;
  long in_RDX;
  double dVar6;
  long *in_stack_00000008;
  long elem;
  int nCols;
  iteratorCol *colData;
  ParseStatusVariables *pv;
  iteratorCol *outcol;
  long in_stack_00000038;
  int startCol;
  long irow;
  int status;
  double *colptr [5];
  histType *histData;
  char *rowselect;
  double axisbin;
  double pix;
  long iaxisbin;
  long ipix;
  long ii;
  long local_d8;
  iteratorCol *local_b8;
  long local_a8;
  long local_98 [4];
  long local_78;
  long *local_70;
  char *local_68;
  long local_48;
  long local_40;
  long local_28;
  long local_20;
  
  local_70 = in_stack_00000008;
  local_28 = in_RCX;
  local_20 = in_RDX;
  memset(local_98,0,0x28);
  if (local_20 == 1) {
    local_70[0x1e] = local_70[0x1d];
  }
  local_68 = (char *)local_70[0x1e];
  for (local_40 = 0; local_40 < 5; local_40 = local_40 + 1) {
    iVar1 = *(int *)((long)local_70 + local_40 * 4 + 0x100);
    local_98[local_40] = 0;
    if (((local_40 < (int)local_70[2]) || (local_40 == 4)) &&
       (-1 < *(int *)((long)local_70 + local_40 * 4 + 0x100))) {
      if (*(int *)(local_70[0x24] + local_40 * 0xe8 + 0x60) < 1) {
        local_b8 = (iteratorCol *)(local_70[0x23] + (long)iVar1 * 0x110);
      }
      else {
        lVar3 = local_70[0x23];
        iVar2 = *(int *)(local_70[0x24] + local_40 * 0xe8 + 0x60);
        iVar4 = fits_parser_workfn(in_stack_00000038,(long)outcol,(long)pv,(long)colData,nCols,
                                   (iteratorCol *)elem,colptr[0]);
        if (iVar4 != 0) {
          return iVar4;
        }
        local_b8 = (iteratorCol *)(lVar3 + (long)iVar1 * 0x110 + (long)(iVar2 + -1) * 0x110);
      }
      if (local_b8 != (iteratorCol *)0x0) {
        pvVar5 = fits_iter_get_array(local_b8);
        local_98[local_40] = (long)pvVar5;
      }
    }
  }
  local_40 = 1;
  local_a8 = 1;
  do {
    if (local_28 < local_a8) {
      local_70[0x1e] = (long)local_68;
      return 0;
    }
    if (local_68 == (char *)0x0) {
LAB_001e1de4:
      for (local_d8 = 1; local_d8 <= local_70[0x1f]; local_d8 = local_d8 + 1) {
        dVar6 = *(double *)(local_98[0] + local_40 * 8);
        if (((dVar6 != -9.1191291391491e-36) || (NAN(dVar6))) &&
           ((local_78 == 0 ||
            ((dVar6 = *(double *)(local_78 + local_40 * 8), dVar6 != -9.1191291391491e-36 ||
             (NAN(dVar6))))))) {
          dVar6 = (*(double *)(local_98[0] + local_40 * 8) - (double)local_70[9]) /
                  (double)local_70[0x11];
          local_48 = (long)(dVar6 + 1.0);
          if ((0 < local_48) &&
             ((local_48 <= local_70[5] &&
              (dVar6 < (double)local_70[0xd] || dVar6 == (double)local_70[0xd])))) {
            if ((int)local_70[2] < 2) goto LAB_001e2177;
            dVar6 = *(double *)(local_98[1] + local_40 * 8);
            if ((dVar6 != -9.1191291391491e-36) || (NAN(dVar6))) {
              dVar6 = (*(double *)(local_98[1] + local_40 * 8) - (double)local_70[10]) /
                      (double)local_70[0x12];
              if ((0.0 <= dVar6) &&
                 (((long)dVar6 < local_70[6] &&
                  (dVar6 < (double)local_70[0xe] || dVar6 == (double)local_70[0xe])))) {
                local_48 = (long)dVar6 * local_70[0x16] + local_48;
                if ((int)local_70[2] < 3) goto LAB_001e2177;
                dVar6 = *(double *)(local_98[2] + local_40 * 8);
                if ((dVar6 != -9.1191291391491e-36) || (NAN(dVar6))) {
                  dVar6 = (*(double *)(local_98[2] + local_40 * 8) - (double)local_70[0xb]) /
                          (double)local_70[0x13];
                  if ((0.0 <= dVar6) &&
                     (((long)dVar6 < local_70[7] &&
                      (dVar6 < (double)local_70[0xf] || dVar6 == (double)local_70[0xf])))) {
                    local_48 = (long)dVar6 * local_70[0x17] + local_48;
                    if ((int)local_70[2] < 4) {
LAB_001e2177:
                      if (((double)local_70[0x1c] != -9.1191291391491e-36) ||
                         (NAN((double)local_70[0x1c]))) {
                        if (*(int *)((long)local_70 + 0x24) == 0x1f) {
                          *(int *)(*local_70 + local_48 * 4) =
                               (int)(double)local_70[0x1c] + *(int *)(*local_70 + local_48 * 4);
                        }
                        else if (*(int *)((long)local_70 + 0x24) == 0x15) {
                          *(short *)(*local_70 + local_48 * 2) =
                               *(short *)(*local_70 + local_48 * 2) +
                               (short)(int)(double)local_70[0x1c];
                        }
                        else if (*(int *)((long)local_70 + 0x24) == 0x2a) {
                          *(float *)(*local_70 + local_48 * 4) =
                               (float)((double)*(float *)(*local_70 + local_48 * 4) +
                                      (double)local_70[0x1c]);
                        }
                        else if (*(int *)((long)local_70 + 0x24) == 0x52) {
                          *(double *)(*local_70 + local_48 * 8) =
                               (double)local_70[0x1c] + *(double *)(*local_70 + local_48 * 8);
                        }
                        else if (*(int *)((long)local_70 + 0x24) == 0xb) {
                          *(char *)(*local_70 + local_48) =
                               *(char *)(*local_70 + local_48) + (char)(int)(double)local_70[0x1c];
                        }
                      }
                      else if ((int)local_70[0x1a] == 0) {
                        if (*(int *)((long)local_70 + 0x24) == 0x1f) {
                          *(int *)(*local_70 + local_48 * 4) =
                               (int)*(double *)(local_78 + local_40 * 8) +
                               *(int *)(*local_70 + local_48 * 4);
                        }
                        else if (*(int *)((long)local_70 + 0x24) == 0x15) {
                          *(short *)(*local_70 + local_48 * 2) =
                               *(short *)(*local_70 + local_48 * 2) +
                               (short)(int)*(double *)(local_78 + local_40 * 8);
                        }
                        else if (*(int *)((long)local_70 + 0x24) == 0x2a) {
                          *(float *)(*local_70 + local_48 * 4) =
                               (float)((double)*(float *)(*local_70 + local_48 * 4) +
                                      *(double *)(local_78 + local_40 * 8));
                        }
                        else if (*(int *)((long)local_70 + 0x24) == 0x52) {
                          *(double *)(*local_70 + local_48 * 8) =
                               *(double *)(local_78 + local_40 * 8) +
                               *(double *)(*local_70 + local_48 * 8);
                        }
                        else if (*(int *)((long)local_70 + 0x24) == 0xb) {
                          *(char *)(*local_70 + local_48) =
                               *(char *)(*local_70 + local_48) +
                               (char)(int)*(double *)(local_78 + local_40 * 8);
                        }
                      }
                      else if (*(int *)((long)local_70 + 0x24) == 0x1f) {
                        *(int *)(*local_70 + local_48 * 4) =
                             (int)(1.0 / *(double *)(local_78 + local_40 * 8)) +
                             *(int *)(*local_70 + local_48 * 4);
                      }
                      else if (*(int *)((long)local_70 + 0x24) == 0x15) {
                        *(short *)(*local_70 + local_48 * 2) =
                             *(short *)(*local_70 + local_48 * 2) +
                             (short)(int)(1.0 / *(double *)(local_78 + local_40 * 8));
                      }
                      else if (*(int *)((long)local_70 + 0x24) == 0x2a) {
                        *(float *)(*local_70 + local_48 * 4) =
                             (float)(1.0 / *(double *)(local_78 + local_40 * 8)) +
                             *(float *)(*local_70 + local_48 * 4);
                      }
                      else if (*(int *)((long)local_70 + 0x24) == 0x52) {
                        *(double *)(*local_70 + local_48 * 8) =
                             1.0 / *(double *)(local_78 + local_40 * 8) +
                             *(double *)(*local_70 + local_48 * 8);
                      }
                      else if (*(int *)((long)local_70 + 0x24) == 0xb) {
                        *(char *)(*local_70 + local_48) =
                             *(char *)(*local_70 + local_48) +
                             (char)(int)(1.0 / *(double *)(local_78 + local_40 * 8));
                      }
                    }
                    else {
                      dVar6 = *(double *)(local_98[3] + local_40 * 8);
                      if ((dVar6 != -9.1191291391491e-36) || (NAN(dVar6))) {
                        dVar6 = (*(double *)(local_98[3] + local_40 * 8) - (double)local_70[0xc]) /
                                (double)local_70[0x14];
                        if ((0.0 <= dVar6) &&
                           (((long)dVar6 < local_70[8] &&
                            (dVar6 < (double)local_70[0x10] || dVar6 == (double)local_70[0x10])))) {
                          local_48 = (long)dVar6 * local_70[0x18] + local_48;
                          goto LAB_001e2177;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        local_40 = local_40 + 1;
      }
    }
    else {
      if (*local_68 != '\0') {
        local_68 = local_68 + 1;
        goto LAB_001e1de4;
      }
      local_68 = local_68 + 1;
      local_40 = local_70[0x1f] + local_40;
    }
    local_a8 = local_a8 + 1;
  } while( true );
}

Assistant:

int ffcalchist(long totalrows, long offset, long firstrow, long nrows,
             int ncols, iteratorCol *colpars, void *userPointer)
/*
   Interator work function that calculates values for the 2D histogram.
*/
{
    long ii, ipix, iaxisbin;
    double pix, axisbin;
    char *rowselect;
    histType *histData = (histType*)userPointer;
    double *colptr[MAXDIMS] = {0};
    int status = 0;
    long irow;

    if (firstrow == 1) {
      histData->rowselector_cur = histData->rowselector;
    }
    rowselect = histData->rowselector_cur;

    for (ii=0; ii<=4; ii++) {
      int startCol = histData->startCols[ii];
      iteratorCol *outcol = 0;
      /* Call calculator work function.  Result is put in final column of colData as a TemporaryCol */
      colptr[ii] = 0;

      /* Do not process unspecified axes (but do process weight column) */
      if ( (ii >= histData->haxis && ii != 4) || histData->startCols[ii] < 0) continue;

      /* We have a parser for this, evaluate it */
      if (histData->parsers[ii].nCols > 0) {
	struct ParseStatusVariables *pv = &(histData->infos[ii].parseVariables);
	iteratorCol *colData = &(histData->iterCols[startCol]);
	int nCols = histData->parsers[ii].nCols;

	status = fits_parser_workfn(totalrows, offset, firstrow, nrows, 
				    nCols, colData, (void *) &(histData->infos[ii]));
	if (status) return status;
	/* Output column is last iterator column, which better be a TemporaryCol */
	outcol = &(colData[nCols-1]);

      } else {
	outcol = &(histData->iterCols[startCol]);
      }

      if (outcol) {
	/* Note that the 0th array element returned by the iterator is
	   actually the null value!  This is actually rather a big
	   undocumented "feature" of the iterator. However, "ii" below
	   starts at a value of 1 which skips over the null value */
	colptr[ii] = ((double *) fits_iter_get_array(outcol));
      }
    }

    /*  Main loop over rows */
    /* irow = row counter (1 .. nrows) */
    /* elem = counter of element (1 .. histData->repeat) for each row */
    /* ii = counts up from 1 (see note below) used to index colptr[]'s */

    /* Note that ii starts at 1 because position [0] in the 
       column data arrays is for the "null" value! */
    for (ii = 1, irow = 1; irow <= nrows; irow++) 
    {
        long elem;
        if (rowselect) {    /* if a row selector array is supplied... */

	  if (*rowselect) {
               rowselect++;   /* this row is included in the histogram */

	  } else {
               rowselect++;   /* this row is excluded from the histogram */

	       ii += histData->repeat; /* skip this portion of data */
               continue;
           }
        }


	/* Loop over elements in each row, increment ii after each element */

        for (elem = 1; elem <= histData->repeat; elem++, ii++) {
	  if (colptr[0][ii] == DOUBLENULLVALUE)  /* test for null value */
            continue;
	  if (colptr[4] && colptr[4][ii] == DOUBLENULLVALUE) /* and null weight */
	    continue;
	  
	  pix = (colptr[0][ii] - histData->amin1) / histData->binsize1;
	  ipix = (long) (pix + 1.); /* add 1 because the 1st pixel is the null value */
	  
	  /* test if bin is within range */
	  if (ipix < 1 || ipix > histData->haxis1 || pix > histData->maxbin1)
            continue;
	  
	  if (histData->haxis > 1)
	    {
	      if (colptr[1][ii] == DOUBLENULLVALUE)
		continue;
	      
	      axisbin = (colptr[1][ii] - histData->amin2) / histData->binsize2;
	      iaxisbin = (long) axisbin;
	      
	      if (axisbin < 0. || iaxisbin >= histData->haxis2 || axisbin > histData->maxbin2)
		continue;
	      
	      ipix += (iaxisbin * histData->incr[1]);
	      
	      if (histData->haxis > 2)
		{
		  if (colptr[2][ii] == DOUBLENULLVALUE)
		    continue;
		  
		  axisbin = (colptr[2][ii] - histData->amin3) / histData->binsize3;
		  iaxisbin = (long) axisbin;
		  if (axisbin < 0. || iaxisbin >= histData->haxis3 || axisbin > histData->maxbin3)
		    continue;
		  
		  ipix += (iaxisbin * histData->incr[2]);
		  
		  if (histData->haxis > 3)
		    {
		      if (colptr[3][ii] == DOUBLENULLVALUE)
			continue;
		      
		      axisbin = (colptr[3][ii] - histData->amin4) / histData->binsize4;
		      iaxisbin = (long) axisbin;
		      if (axisbin < 0. || iaxisbin >= histData->haxis4 || axisbin > histData->maxbin4)
			continue;
		      
		      ipix += (iaxisbin * histData->incr[3]);
		      
		    }  /* end of haxis > 3 case */
		}    /* end of haxis > 2 case */
	    }      /* end of haxis > 1 case */

	  /* increment the histogram pixel */
	  if (histData->weight != DOUBLENULLVALUE) /* constant weight factor */
	    {   /* Note that if wtrecip == 1, the reciprocal was precomputed above */
	      if (histData->himagetype == TINT)
		histData->hist.j[ipix] += (int) histData->weight;
	      else if (histData->himagetype == TSHORT)
		histData->hist.i[ipix] += (short) histData->weight;
	      else if (histData->himagetype == TFLOAT)
		histData->hist.r[ipix] += histData->weight;
	      else if (histData->himagetype == TDOUBLE)
		histData->hist.d[ipix] += histData->weight;
	      else if (histData->himagetype == TBYTE)
		histData->hist.b[ipix] += (char) histData->weight;
	    }
	  else if (histData->wtrecip) /* use reciprocal of the weight */
	    {
	      if (histData->himagetype == TINT)
		histData->hist.j[ipix] += (int) (1./colptr[4][ii]);
	      else if (histData->himagetype == TSHORT)
		histData->hist.i[ipix] += (short) (1./colptr[4][ii]);
	      else if (histData->himagetype == TFLOAT)
		histData->hist.r[ipix] += (float) (1./colptr[4][ii]);
	      else if (histData->himagetype == TDOUBLE)
		histData->hist.d[ipix] += 1./colptr[4][ii];
	      else if (histData->himagetype == TBYTE)
		histData->hist.b[ipix] += (char) (1./colptr[4][ii]);
	    }
	  else   /* no weights */
	    {
	      if (histData->himagetype == TINT)
		histData->hist.j[ipix] += (int) colptr[4][ii];
	      else if (histData->himagetype == TSHORT)
		histData->hist.i[ipix] += (short) colptr[4][ii];
	      else if (histData->himagetype == TFLOAT)
		histData->hist.r[ipix] += colptr[4][ii];
	      else if (histData->himagetype == TDOUBLE)
		histData->hist.d[ipix] += colptr[4][ii];
	      else if (histData->himagetype == TBYTE)
		histData->hist.b[ipix] += (char) colptr[4][ii];
	    }

	} /* end of loop over elements per row */

    }  /* end of main loop over all rows */

    histData->rowselector_cur = rowselect; /* Save row pointer for next go-round */
    return(status);
}